

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

void __thiscall IceCore::Container::operator=(Container *this,Container *object)

{
  SetSize(this,object->mCurNbEntries);
  memcpy(this->mEntries,object->mEntries,(ulong)(this->mMaxNbEntries << 2));
  this->mCurNbEntries = this->mMaxNbEntries;
  return;
}

Assistant:

void Container::operator=(const Container& object)
{
	SetSize(object.GetNbEntries());
	CopyMemory(mEntries, object.GetEntries(), mMaxNbEntries*sizeof(udword));
	mCurNbEntries = mMaxNbEntries;
}